

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::MergePartialFromCodedStream
          (CategoricalDistributionLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  int iVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  pair<unsigned_long,_bool> pVar12;
  pair<unsigned_long,_bool> pVar13;
  undefined8 local_38;
  
  local_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bd934;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bd934:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar6 = (uint32)uVar10;
    iVar7 = 6;
    iVar8 = iVar7;
    if ((uVar10 & 0x100000000) == 0) goto switchD_003bd998_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 != '\b') break;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar12._8_8_ = 1;
        pVar12.first = (long)(char)uVar2;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->seed_ = pVar12.first;
        goto LAB_003bd97a;
      }
      goto LAB_003bd97c;
    case 2:
      if (cVar9 != '\x10') break;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar13._8_8_ = 1;
        pVar13.first = (long)(char)uVar2;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_003bd97c;
      this->numsamples_ = pVar13.first;
      goto LAB_003bd97a;
    case 3:
      if (cVar9 == '\x18') {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar11._8_8_ = 1;
          pVar11.first = (long)(char)uVar2;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003bd97c;
        this->islogits_ = pVar11.first != 0;
        goto LAB_003bd97a;
      }
      break;
    case 4:
      if (cVar9 == '%') {
        puVar4 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar5) goto LAB_003bd97c;
        }
        else {
          local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar4);
          input->buffer_ = puVar4 + 4;
        }
        this->eps_ = (float)local_38;
        goto LAB_003bd97a;
      }
      break;
    case 5:
      if (cVar9 == '-') {
        puVar4 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&local_38 + 4));
          if (!bVar5) goto LAB_003bd97c;
        }
        else {
          local_38 = CONCAT44(*(undefined4 *)puVar4,(float)local_38);
          input->buffer_ = puVar4 + 4;
        }
        this->temperature_ = local_38._4_4_;
        goto LAB_003bd97a;
      }
    }
switchD_003bd998_default:
    iVar8 = 7;
    if (((uVar6 & 7) != 4 && uVar6 != 0) &&
       (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar7,
       bVar5)) {
LAB_003bd97a:
      iVar8 = 0;
    }
LAB_003bd97c:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool CategoricalDistributionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CategoricalDistributionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 numSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &numsamples_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isLogits = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &islogits_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float temperature = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &temperature_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CategoricalDistributionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CategoricalDistributionLayerParams)
  return false;
#undef DO_
}